

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O1

void __thiscall FlowInfo::collectEdges(FlowInfo *this)

{
  _List_node_base **pp_Var1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  PcodeOp *op;
  pointer pAVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  byte bVar7;
  _List_node_base *p_Var8;
  JumpTable *pJVar9;
  PcodeOp *pPVar10;
  LowlevelError *this_00;
  _Self __tmp;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *plVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  string local_50;
  
  if ((int)((ulong)((long)(this->bblocks->list).
                          super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->bblocks->list).
                         super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Basic blocks already calculated\n","");
    LowlevelError::LowlevelError(this_00,&local_50);
    __cxa_throw(this_00,&RecovError::typeinfo,LowlevelError::~LowlevelError);
  }
  p_Var8 = (this->obank->deadlist).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  plVar11 = &this->obank->deadlist;
  if (p_Var8 != (_List_node_base *)plVar11) {
    do {
      p_Var3 = p_Var8->_M_next;
      if (p_Var3 == (_List_node_base *)plVar11) {
        bVar7 = 1;
      }
      else {
        bVar7 = *(byte *)&(p_Var3[1]._M_next)->_M_prev & 1;
      }
      op = (PcodeOp *)p_Var8[1]._M_next;
      switch(op->opcode->opcode) {
      case CPUI_CBRANCH:
        pPVar10 = fallthruOp(this,op);
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = (_List_node_base *)op;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar2 = &(this->block_edge1).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                  _M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = (_List_node_base *)pPVar10;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar2 = &(this->block_edge2).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                  _M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
      case CPUI_BRANCH:
        pPVar10 = branchTarget(this,op);
LAB_002902e4:
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = (_List_node_base *)op;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar2 = &(this->block_edge1).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                  _M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = (_List_node_base *)pPVar10;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar2 = &(this->block_edge2).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                  _M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        break;
      case CPUI_BRANCHIND:
        pJVar9 = Funcdata::findJumpTable(this->data,op);
        if (pJVar9 != (JumpTable *)0x0) {
          uVar12 = (uint)((ulong)((long)(pJVar9->addresstable).
                                        super__Vector_base<Address,_std::allocator<Address>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pJVar9->addresstable).
                                       super__Vector_base<Address,_std::allocator<Address>_>._M_impl
                                       .super__Vector_impl_data._M_start) >> 4);
          if (0 < (int)uVar12) {
            uVar13 = (ulong)(uVar12 & 0x7fffffff);
            lVar14 = 8;
            do {
              pAVar4 = (pJVar9->addresstable).super__Vector_base<Address,_std::allocator<Address>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              local_50._M_dataplus._M_p = *(pointer *)((long)pAVar4 + lVar14 + -8);
              local_50._M_string_length = *(size_type *)((long)&pAVar4->base + lVar14);
              pPVar10 = target(this,(Address *)&local_50);
              if ((pPVar10->flags >> 0xd & 1) == 0) {
                pPVar10->flags = pPVar10->flags | 0x2000;
                p_Var8 = (_List_node_base *)operator_new(0x18);
                p_Var8[1]._M_next = (_List_node_base *)op;
                std::__detail::_List_node_base::_M_hook(p_Var8);
                psVar2 = &(this->block_edge1).
                          super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
                          _M_size;
                *psVar2 = *psVar2 + 1;
                p_Var8 = (_List_node_base *)operator_new(0x18);
                p_Var8[1]._M_next = (_List_node_base *)pPVar10;
                std::__detail::_List_node_base::_M_hook(p_Var8);
                psVar2 = &(this->block_edge2).
                          super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
                          _M_size;
                *psVar2 = *psVar2 + 1;
              }
              lVar14 = lVar14 + 0x10;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
          p_Var8 = (this->block_edge1).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                   _M_impl._M_node.super__List_node_base._M_next;
          p_Var5 = (_List_node_base *)&this->block_edge1;
          p_Var6 = (_List_node_base *)&this->block_edge2;
          while ((p_Var5 != p_Var8 && (p_Var5 = p_Var5->_M_prev, (PcodeOp *)p_Var5[1]._M_next == op)
                 )) {
            p_Var6 = p_Var6->_M_prev;
            pp_Var1 = &(p_Var6[1]._M_next)->_M_prev;
            *(uint *)pp_Var1 = *(uint *)pp_Var1 & 0xffffdfff;
          }
        }
        break;
      default:
        if (bVar7 == 0) break;
        pPVar10 = fallthruOp(this,op);
        goto LAB_002902e4;
      case CPUI_RETURN:
        break;
      }
      p_Var8 = p_Var3;
    } while (p_Var3 != (_List_node_base *)plVar11);
  }
  return;
}

Assistant:

void FlowInfo::collectEdges(void)

{
  list<PcodeOp *>::const_iterator iter,iterend,iter1,iter2;
  PcodeOp *op,*targ_op;
  JumpTable *jt;
  bool nextstart;
  int4 i,num;

  if (bblocks.getSize() != 0)
    throw RecovError("Basic blocks already calculated\n");

  iter = obank.beginDead();
  iterend = obank.endDead();
  while(iter!=iterend) {
    op = *iter++;
    if (iter==iterend)
      nextstart = true;
    else
      nextstart = (*iter)->isBlockStart();
    switch(op->code()) {
    case CPUI_BRANCH:
      targ_op = branchTarget(op);
      block_edge1.push_back(op);
      //      block_edge2.push_back(op->Input(0)->getAddr().Iop());
      block_edge2.push_back(targ_op);
      break;
    case CPUI_BRANCHIND:
      jt = data.findJumpTable(op);
      if (jt == (JumpTable *)0) break;
				// If we are in this routine and there is no table
				// Then we must be doing partial flow analysis
				// so assume there are no branches out
      num = jt->numEntries();
      for(i=0;i<num;++i) {
	targ_op = target(jt->getAddressByIndex(i));
	if (targ_op->isMark()) continue; // Already a link between these blocks
	targ_op->setMark();
	block_edge1.push_back(op);
	block_edge2.push_back(targ_op);
      }
      iter1 = block_edge1.end(); // Clean up our marks
      iter2 = block_edge2.end();
      while(iter1 != block_edge1.begin()) {
	--iter1;
	--iter2;
	if ((*iter1)==op)
	  (*iter2)->clearMark();
	else
	  break;
      }
      break;
    case CPUI_RETURN:
      break;
    case CPUI_CBRANCH:
      targ_op = fallthruOp(op); // Put in fallthru edge
      block_edge1.push_back(op);
      block_edge2.push_back(targ_op);
      targ_op = branchTarget(op);
      block_edge1.push_back(op);
      block_edge2.push_back(targ_op);
      break;
    default:
      if (nextstart) {		// Put in fallthru edge if new basic block
	targ_op = fallthruOp(op);
	block_edge1.push_back(op);
	block_edge2.push_back(targ_op);
      }
      break;
    }
  }
}